

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall mkvparser::Chapters::Atom::ShallowCopy(Atom *this,Atom *rhs)

{
  Atom *rhs_local;
  Atom *this_local;
  
  rhs->m_string_uid = this->m_string_uid;
  rhs->m_uid = this->m_uid;
  rhs->m_start_timecode = this->m_start_timecode;
  rhs->m_stop_timecode = this->m_stop_timecode;
  rhs->m_displays = this->m_displays;
  rhs->m_displays_size = this->m_displays_size;
  rhs->m_displays_count = this->m_displays_count;
  return;
}

Assistant:

void Chapters::Atom::ShallowCopy(Atom& rhs) const {
  rhs.m_string_uid = m_string_uid;
  rhs.m_uid = m_uid;
  rhs.m_start_timecode = m_start_timecode;
  rhs.m_stop_timecode = m_stop_timecode;

  rhs.m_displays = m_displays;
  rhs.m_displays_size = m_displays_size;
  rhs.m_displays_count = m_displays_count;
}